

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lesson.h
# Opt level: O3

void __thiscall
Lesson::Lesson(Lesson *this,size_t i,string *data,
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor>_>_>
              *preps_map)

{
  string *psVar1;
  pointer pcVar2;
  int iVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  raw_preps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  raw_data;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  time_splits;
  Professor realPrep;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b0;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_198;
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_190;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  Professor local_e0;
  
  psVar1 = &this->subject;
  (this->subject)._M_dataplus._M_p = (pointer)&(this->subject).field_2;
  (this->subject)._M_string_length = 0;
  (this->subject).field_2._M_local_buf[0] = '\0';
  (this->room)._M_dataplus._M_p = (pointer)&(this->room).field_2;
  (this->room)._M_string_length = 0;
  (this->room).field_2._M_local_buf[0] = '\0';
  (this->professor)._M_dataplus._M_p = (pointer)&(this->professor).field_2;
  (this->professor)._M_string_length = 0;
  (this->professor).field_2._M_local_buf[0] = '\0';
  (this->prep_list).super__Vector_base<Professor,_std::allocator<Professor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->prep_list).super__Vector_base<Professor,_std::allocator<Professor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->prep_list).super__Vector_base<Professor,_std::allocator<Professor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->time)._M_dataplus._M_p = (pointer)&(this->time).field_2;
  (this->time)._M_string_length = 0;
  (this->time).field_2._M_local_buf[0] = '\0';
  local_190._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_190._M_impl.super__Rb_tree_header._M_header;
  local_190._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_190._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_190._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e0.prep_id = 0;
  local_198 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)preps_map;
  local_190._M_impl.super__Rb_tree_header._M_header._M_right =
       local_190._M_impl.super__Rb_tree_header._M_header._M_left;
  pmVar4 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_190,&local_e0.prep_id);
  std::__cxx11::string::_M_replace((ulong)pmVar4,0,(char *)pmVar4->_M_string_length,0x11d1e4);
  local_e0.prep_id = 1;
  pmVar4 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_190,&local_e0.prep_id);
  std::__cxx11::string::_M_replace((ulong)pmVar4,0,(char *)pmVar4->_M_string_length,0x11d1ef);
  local_e0.prep_id = 2;
  pmVar4 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_190,&local_e0.prep_id);
  std::__cxx11::string::_M_replace((ulong)pmVar4,0,(char *)pmVar4->_M_string_length,0x11d1fb);
  local_e0.prep_id = 3;
  pmVar4 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_190,&local_e0.prep_id);
  std::__cxx11::string::_M_replace((ulong)pmVar4,0,(char *)pmVar4->_M_string_length,0x11d207);
  local_e0.prep_id = 4;
  pmVar4 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_190,&local_e0.prep_id);
  std::__cxx11::string::_M_replace((ulong)pmVar4,0,(char *)pmVar4->_M_string_length,0x11d213);
  local_e0.prep_id = 5;
  pmVar4 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_190,&local_e0.prep_id);
  std::__cxx11::string::_M_replace((ulong)pmVar4,0,(char *)pmVar4->_M_string_length,0x11d21f);
  local_e0.prep_id = 6;
  pmVar4 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_190,&local_e0.prep_id);
  std::__cxx11::string::_M_replace((ulong)pmVar4,0,(char *)pmVar4->_M_string_length,0x11d22b);
  pcVar2 = (data->_M_dataplus)._M_p;
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_100,pcVar2,pcVar2 + data->_M_string_length);
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"#","");
  split(&local_1b0,&local_100,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  this->lesson_id = i;
  this->exist = false;
  iVar3 = std::__cxx11::string::compare
                    ((char *)local_1b0.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  if (iVar3 == 0) goto LAB_00116efb;
  this->exist = true;
  this->moveable = true;
  std::__cxx11::string::_M_assign((string *)psVar1);
  std::__cxx11::string::_M_assign((string *)&this->professor);
  std::__cxx11::string::_M_assign((string *)&this->room);
  local_e0.prep_id = (int)i + (int)(i / 7) * -7;
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_190,&local_e0.prep_id);
  std::__cxx11::string::_M_assign((string *)&this->time);
  iVar3 = std::__cxx11::string::compare((char *)psVar1);
  bVar8 = true;
  if (iVar3 != 0) {
    iVar3 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar3 != 0) {
      iVar3 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar3 != 0) {
        iVar3 = std::__cxx11::string::compare((char *)psVar1);
        bVar8 = iVar3 == 0;
      }
    }
  }
  this->doubled = bVar8;
  iVar3 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar3 == 0) {
LAB_00116d53:
    this->moveable = false;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar3 == 0) goto LAB_00116d53;
    iVar3 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar3 == 0) goto LAB_00116d53;
    iVar3 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar3 == 0) goto LAB_00116d53;
    iVar3 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar3 == 0) goto LAB_00116d53;
    iVar3 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar3 == 0) goto LAB_00116d53;
  }
  pcVar2 = (this->professor)._M_dataplus._M_p;
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,pcVar2,pcVar2 + (this->professor)._M_string_length);
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"_","");
  split(&local_1c8,&local_140,&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if (local_1c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_1c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar6 = 0;
    uVar7 = 0;
    do {
      pmVar5 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[](local_198,
                            (key_type *)
                            ((long)&((local_1c8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar6));
      Professor::Professor(&local_e0,pmVar5);
      std::vector<Professor,_std::allocator<Professor>_>::push_back(&this->prep_list,&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.link._M_dataplus._M_p != &local_e0.link.field_2) {
        operator_delete(local_e0.link._M_dataplus._M_p,
                        local_e0.link.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.middle_name._M_dataplus._M_p != &local_e0.middle_name.field_2) {
        operator_delete(local_e0.middle_name._M_dataplus._M_p,
                        local_e0.middle_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.surname._M_dataplus._M_p != &local_e0.surname.field_2) {
        operator_delete(local_e0.surname._M_dataplus._M_p,
                        local_e0.surname.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.name._M_dataplus._M_p != &local_e0.name.field_2) {
        operator_delete(local_e0.name._M_dataplus._M_p,
                        local_e0.name.field_2._M_allocated_capacity + 1);
      }
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x20;
    } while (uVar7 < (ulong)((long)local_1c8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_1c8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c8);
LAB_00116efb:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b0);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_190);
  return;
}

Assistant:

Lesson(size_t i, std::string data, std::unordered_map <std::string, Professor> preps_map) {

        std::map< int, std::string > time_splits;
        time_splits[0] = "9:00-10:25";
        time_splits[1] = "10:45-12:10";
        time_splits[2] = "12:20-13:45";
        time_splits[3] = "13:55-15:20";
        time_splits[4] = "15:30-16:55";
        time_splits[5] = "17:05-18:30";
        time_splits[6] = "18:35-20:00";
        //std::cout << "data " << data << std::endl;
        std::vector <std::string> raw_data = split(data, "#");
        lesson_id = i;
        exist = false;
        if (raw_data[0] != "") {

            exist = true;
            //std::cout << raw_data[0] << " " << raw_data[1] << " " <<raw_data[2] << " " << raw_data[3] << std::endl;
            moveable = true;
            subject = raw_data[0];
            professor = raw_data[1];
            room = raw_data[2];
            time = time_splits[i%7];
            if((subject == "Компьютерные технологии") || (subject == "Общая физика: лаб.практикум") || (subject == "Доп. главы дискретного анализа") || (subject== "Современные проблемы прикладной математики") ) {
                doubled = true;
            }
            else {
                doubled = false;
            }

            if ((subject == "Доп. главы дискретного анализа") || ((subject == "Дифференциальные уравнения"))
            || (subject == "Гармонический анализ") || (subject == "Мера и интеграл Лебега") || (subject == "Ин.яз.") || (subject == "Современные проблемы прикладной математики")) {
               moveable = false;
            }

            std::vector <std::string> raw_preps = split(professor, "_");
            for(size_t i = 0; i < raw_preps.size(); i++) {

                Professor realPrep = Professor(preps_map[raw_preps[i]]);
                prep_list.push_back(realPrep);
            }
        }

    }